

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> * __thiscall
pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>::
def<anurbs::Ref<anurbs::Surface<2l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<2l>>>>(*)(anurbs::Model&,std::shared_ptr<anurbs::Surface<2l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<2l>>>>,std::__cxx11::string_const&),pybind11::arg,pybind11::arg>
          (class_<anurbs::Model,std::shared_ptr<anurbs::Model>> *this,char *name_,
          _func_Ref<anurbs::Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_>_>_Model_ptr_shared_ptr<anurbs::Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
          **f,arg *extra,arg *extra_1)

{
  _func_Ref<anurbs::Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_>_>_Model_ptr_shared_ptr<anurbs::Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
  *f_00;
  _func_Ref<anurbs::Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_>_>_Model_ptr_shared_ptr<anurbs::Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
  **pp_Var1;
  handle local_b0;
  PyObject *local_a8;
  obj_attr_accessor local_a0;
  handle local_70;
  PyObject *local_68;
  handle local_60;
  handle local_58;
  sibling local_50;
  is_method local_48;
  name local_40;
  cpp_function local_38;
  cpp_function cf;
  arg *extra_local_1;
  arg *extra_local;
  _func_Ref<anurbs::Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_>_>_Model_ptr_shared_ptr<anurbs::Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
  **f_local;
  char *name__local;
  class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *this_local;
  
  cf.super_function.super_object.super_handle.m_ptr = (function)(function)extra_1;
  pp_Var1 = method_adaptor<anurbs::Model,anurbs::Ref<anurbs::Surface<2l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<2l>>>>(*)(anurbs::Model&,std::shared_ptr<anurbs::Surface<2l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<2l>>>>,std::__cxx11::string_const&)>
                      (f);
  f_00 = *pp_Var1;
  pybind11::name::name(&local_40,name_);
  is_method::is_method(&local_48,(handle *)this);
  local_60.m_ptr = *(PyObject **)this;
  none::none((none *)&local_70);
  local_68 = local_70.m_ptr;
  getattr((pybind11 *)&local_58,local_60,name_,local_70);
  sibling::sibling(&local_50,&local_58);
  cpp_function::
  cpp_function<anurbs::Ref<anurbs::Surface<2l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<2l>>>>,anurbs::Model&,std::shared_ptr<anurbs::Surface<2l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<2l>>>>,std::__cxx11::string_const&,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::arg,pybind11::arg>
            (&local_38,f_00,&local_40,&local_48,&local_50,extra,
             (arg *)cf.super_function.super_object.super_handle.m_ptr);
  pybind11::object::~object((object *)&local_58);
  none::~none((none *)&local_70);
  cpp_function::name((cpp_function *)&local_b0);
  local_a8 = local_b0.m_ptr;
  detail::object_api<pybind11::handle>::attr
            (&local_a0,(object_api<pybind11::handle> *)this,local_b0);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::operator=(&local_a0,&local_38);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::~accessor(&local_a0);
  pybind11::object::~object((object *)&local_b0);
  cpp_function::~cpp_function(&local_38);
  return (class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *)this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        attr(cf.name()) = cf;
        return *this;
    }